

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

SessionID * __thiscall
FIX::Message::getSessionID(SessionID *__return_storage_ptr__,Message *this,string *qualifier)

{
  Header *this_00;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  BeginString beginString;
  FieldBase local_140;
  FieldBase local_e0;
  FieldBase local_80;
  
  StringField::StringField((StringField *)&local_80,8);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ea660;
  StringField::StringField((StringField *)&local_e0,0x31);
  local_e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ea700;
  StringField::StringField((StringField *)&local_140,0x38);
  local_140._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ea738;
  this_00 = &this->m_header;
  FieldMap::getField(&this_00->super_FieldMap,&local_80);
  FieldMap::getField(&this_00->super_FieldMap,&local_e0);
  FieldMap::getField(&this_00->super_FieldMap,&local_140);
  SessionID::SessionID
            (__return_storage_ptr__,&local_80.m_string,&local_e0.m_string,&local_140.m_string,
             qualifier);
  FieldBase::~FieldBase(&local_140);
  FieldBase::~FieldBase(&local_e0);
  FieldBase::~FieldBase(&local_80);
  return __return_storage_ptr__;
}

Assistant:

SessionID Message::getSessionID( const std::string& qualifier ) const
EXCEPT ( FieldNotFound )
{
  BeginString beginString;
  SenderCompID senderCompID;
  TargetCompID targetCompID;

  getHeader().getField( beginString );
  getHeader().getField( senderCompID );
  getHeader().getField( targetCompID );

  return SessionID( beginString, senderCompID, targetCompID, qualifier );
}